

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O2

ostream * ASDCP::operator<<(ostream *strm,WriterInfo *Info)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  UUID local_78;
  char str_buf [40];
  
  poVar1 = std::operator<<(strm,"       ProductUUID: ");
  local_78.super_Identifier<16U>.m_HasValue = true;
  local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->ProductUUID;
  local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->ProductUUID + 8);
  local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  pcVar2 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"    ProductVersion: ");
  poVar1 = std::operator<<(poVar1,(string *)&Info->ProductVersion);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"       CompanyName: ");
  poVar1 = std::operator<<(poVar1,(string *)&Info->CompanyName);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"       ProductName: ");
  poVar1 = std::operator<<(poVar1,(string *)&Info->ProductName);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"  EncryptedEssence: ");
  pcVar3 = "No";
  pcVar2 = "No";
  if (Info->EncryptedEssence != false) {
    pcVar2 = "Yes";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (Info->EncryptedEssence == true) {
    poVar1 = std::operator<<(strm,"              HMAC: ");
    if (Info->UsesHMAC != false) {
      pcVar3 = "Yes";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(strm,"         ContextID: ");
    local_78.super_Identifier<16U>.m_HasValue = true;
    local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->ContextID;
    local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->ContextID + 8);
    local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_00216010;
    pcVar2 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(strm,"CryptographicKeyID: ");
    local_78.super_Identifier<16U>.m_HasValue = true;
    local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->CryptographicKeyID;
    local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->CryptographicKeyID + 8);
    local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_00216010;
    pcVar2 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<(strm,"         AssetUUID: ");
  local_78.super_Identifier<16U>.m_HasValue = true;
  local_78.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)Info->AssetUUID;
  local_78.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(Info->AssetUUID + 8);
  local_78.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00216010;
  pcVar2 = Kumu::UUID::EncodeHex(&local_78,str_buf,0x28);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"    Label Set Type: ");
  pcVar2 = "Unknown";
  if (Info->LabelSetType == LS_MXF_INTEROP) {
    pcVar2 = "MXF Interop";
  }
  pcVar3 = "SMPTE";
  if (Info->LabelSetType != LS_MXF_SMPTE) {
    pcVar3 = pcVar2;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  return strm;
}

Assistant:

std::ostream&
ASDCP::operator << (std::ostream& strm, const WriterInfo& Info)
{
  char str_buf[40];

  strm << "       ProductUUID: " << UUID(Info.ProductUUID).EncodeHex(str_buf, 40) << std::endl;
  strm << "    ProductVersion: " << Info.ProductVersion << std::endl;
  strm << "       CompanyName: " << Info.CompanyName << std::endl;
  strm << "       ProductName: " << Info.ProductName << std::endl;
  strm << "  EncryptedEssence: " << (Info.EncryptedEssence ? "Yes" : "No") << std::endl;

  if ( Info.EncryptedEssence )
    {
      strm << "              HMAC: " << (Info.UsesHMAC ? "Yes" : "No") << std::endl;
      strm << "         ContextID: " << UUID(Info.ContextID).EncodeHex(str_buf, 40) << std::endl;
      strm << "CryptographicKeyID: " << UUID(Info.CryptographicKeyID).EncodeHex(str_buf, 40) << std::endl;
    }

  strm << "         AssetUUID: " << UUID(Info.AssetUUID).EncodeHex(str_buf, 40) << std::endl;
  strm << "    Label Set Type: " << (Info.LabelSetType == LS_MXF_SMPTE ? "SMPTE" :
				     (Info.LabelSetType == LS_MXF_INTEROP ? "MXF Interop" :
				      "Unknown")) << std::endl;
  return strm;
}